

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExpandSubquery(Parse *pParse,SrcList_item *pFrom)

{
  long lVar1;
  Table *pTVar2;
  char *pcVar3;
  Table *pTab;
  Select *pSel;
  SrcList_item *pFrom_local;
  Parse *pParse_local;
  
  pTab = (Table *)pFrom->pSelect;
  pTVar2 = (Table *)sqlite3DbMallocZero(pParse->db,0x80);
  pFrom->pTab = pTVar2;
  if (pTVar2 == (Table *)0x0) {
    pParse_local._4_4_ = 7;
  }
  else {
    pTVar2->nTabRef = 1;
    if (pFrom->zAlias == (char *)0x0) {
      pcVar3 = sqlite3MPrintf(pParse->db,"subquery_%u",(ulong)*(uint *)&pTab->pSelect);
      pTVar2->zName = pcVar3;
    }
    else {
      pcVar3 = sqlite3DbStrDup(pParse->db,pFrom->zAlias);
      pTVar2->zName = pcVar3;
    }
    for (; lVar1._0_4_ = pTab->addColOffset, lVar1._4_4_ = pTab->nModuleArg, lVar1 != 0;
        pTab = *(Table **)&pTab->addColOffset) {
    }
    sqlite3ColumnsFromExprList(pParse,(ExprList *)pTab->zName,&pTVar2->nCol,&pTVar2->aCol);
    pTVar2->iPKey = -1;
    pTVar2->nRowLogEst = 200;
    pTVar2->tabFlags = pTVar2->tabFlags | 2;
    pParse_local._4_4_ = (uint)(pParse->nErr != 0);
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExpandSubquery(Parse *pParse, struct SrcList_item *pFrom){
  Select *pSel = pFrom->pSelect;
  Table *pTab;

  assert( pSel );
  pFrom->pTab = pTab = sqlite3DbMallocZero(pParse->db, sizeof(Table));
  if( pTab==0 ) return SQLITE_NOMEM;
  pTab->nTabRef = 1;
  if( pFrom->zAlias ){
    pTab->zName = sqlite3DbStrDup(pParse->db, pFrom->zAlias);
  }else{
    pTab->zName = sqlite3MPrintf(pParse->db, "subquery_%u", pSel->selId);
  }
  while( pSel->pPrior ){ pSel = pSel->pPrior; }
  sqlite3ColumnsFromExprList(pParse, pSel->pEList,&pTab->nCol,&pTab->aCol);
  pTab->iPKey = -1;
  pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
  pTab->tabFlags |= TF_Ephemeral;

  return pParse->nErr ? SQLITE_ERROR : SQLITE_OK;
}